

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

void __thiscall capnp::Schema::requireUsableAs(Schema *this,RawSchema *expected)

{
  RawSchema *pRVar1;
  Fault f;
  Fault local_10;
  
  pRVar1 = this->raw->generic;
  if ((pRVar1 != expected) && ((expected == (RawSchema *)0x0 || (pRVar1->canCastTo != expected)))) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x133,FAILED,
               "raw->generic == expected || (expected != nullptr && raw->generic->canCastTo == expected)"
               ,"\"This schema is not compatible with the requested native type.\"",
               (char (*) [62])"This schema is not compatible with the requested native type.");
    kj::_::Debug::Fault::fatal(&local_10);
  }
  return;
}

Assistant:

void Schema::requireUsableAs(const _::RawSchema* expected) const {
  KJ_REQUIRE(raw->generic == expected ||
             (expected != nullptr && raw->generic->canCastTo == expected),
             "This schema is not compatible with the requested native type.");
}